

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

uint FIX::IntTConvertor<unsigned_int>::convert(string *value)

{
  char *pcVar1;
  byte bVar2;
  uint uVar3;
  FieldConvertError *this;
  size_type sVar4;
  uint uVar5;
  
  if ((value->_M_string_length != 0) && (pcVar1 = (value->_M_dataplus)._M_p, *pcVar1 != '-')) {
    sVar4 = 0;
    uVar5 = 0;
    while (((uVar5 < 0x1999999a && (bVar2 = pcVar1[sVar4] - 0x30, bVar2 < 10)) &&
           (uVar3 = (uint)bVar2 + uVar5 * 10, uVar5 <= uVar3))) {
      sVar4 = sVar4 + 1;
      uVar5 = uVar3;
      if (value->_M_string_length == sVar4) {
        return uVar3;
      }
    }
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    T result = 0;
    if (!convert(value.begin(), value.end(), result)) {
      throw FieldConvertError(value);
    } else {
      return result;
    }
  }